

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderVariableManagerGL::
GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>::SetDynamicOffset
          (GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo> *this,
          Uint32 ArrayIndex,Uint32 Offset)

{
  string msg;
  string local_28;
  
  FormatString<char[63]>
            (&local_28,
             (char (*) [63])"Dynamic offset may only be set for uniform and storage buffers");
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"SetDynamicOffset",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
             ,0x73);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SetDynamicOffset(Uint32 ArrayIndex, Uint32 Offset)
        {
            UNSUPPORTED("Dynamic offset may only be set for uniform and storage buffers");
        }